

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qobject.cpp
# Opt level: O2

void __thiscall QObjectPrivate::setParent_helper(QObjectPrivate *this,QObject *o)

{
  QObjectList *vector;
  uint uVar1;
  QObject *pQVar2;
  QObjectData *pQVar3;
  qsizetype qVar4;
  pointer ppQVar5;
  ulong i;
  long in_FS_OFFSET;
  QMessageLogger local_68;
  QObject *q;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  q = (this->super_QObjectData).q_ptr;
  pQVar2 = (this->super_QObjectData).parent;
  if (pQVar2 != o) {
    if ((pQVar2 != (QObject *)0x0) &&
       (((pQVar3 = (pQVar2->d_ptr).d, (pQVar3->field_0x30 & 8) == 0 ||
         (((this->super_QObjectData).field_0x30 & 4) == 0)) ||
        ((QObject *)pQVar3[1].children.d.d != q)))) {
      vector = &pQVar3->children;
      qVar4 = QtPrivate::indexOf<QObject*,QObject*>(vector,&q,0);
      if (-1 < (int)(uint)qVar4) {
        i = (ulong)((uint)qVar4 & 0x7fffffff);
        if ((pQVar3->field_0x30 & 8) == 0) {
          QList<QObject_*>::removeAt(vector,i);
          if ((((this->super_QObjectData).field_0x30 & 0x10) != 0) &&
             ((pQVar3->field_0x30 & 0x20) != 0)) {
            local_68.context.function._0_4_ = 0xaaaaaaaa;
            local_68.context.function._4_4_ = 0xaaaaaaaa;
            local_68.context.version = -0x55555556;
            local_68.context.line = -0x55555556;
            local_68.context.file._0_2_ = 0xaaaa;
            local_68.context.file._2_1_ = true;
            local_68.context.file._3_1_ = true;
            local_68.context.file._4_1_ = true;
            local_68.context.file._5_1_ = true;
            local_68.context.file._6_2_ = 0xaaaa;
            QChildEvent::QChildEvent((QChildEvent *)&local_68,ChildRemoved,q);
            QCoreApplication::sendEvent((this->super_QObjectData).parent,(QEvent *)&local_68);
            QTimerEvent::~QTimerEvent((QTimerEvent *)&local_68);
          }
        }
        else {
          ppQVar5 = QList<QObject_*>::data(vector);
          ppQVar5[i] = (QObject *)0x0;
        }
      }
    }
    if (((this->super_QObjectData).field_0x31 & 8) != 0) {
      local_68.context.version = -0x55555556;
      local_68.context.line = -0x55555556;
      local_68.context.file._0_2_ = 0xaaaa;
      local_68.context.file._2_1_ = true;
      local_68.context.file._3_1_ = true;
      local_68.context.file._4_1_ = true;
      local_68.context.file._5_1_ = true;
      local_68.context.file._6_2_ = 0xaaaa;
      QEvent::QEvent((QEvent *)&local_68,ParentAboutToChange);
      QCoreApplication::sendEvent(q,(QEvent *)&local_68);
      QTimerEvent::~QTimerEvent((QTimerEvent *)&local_68);
    }
    (this->super_QObjectData).parent = o;
    if (o != (QObject *)0x0) {
      pQVar3 = (o->d_ptr).d;
      if ((this->threadData).super_QBasicAtomicPointer<QThreadData>._q_value._M_b._M_p !=
          (__pointer_type)pQVar3[1].q_ptr) {
        local_68.context.version = 2;
        local_68.context.function._4_4_ = 0;
        local_68.context.line = 0;
        local_68.context.file._0_2_ = 0;
        local_68.context.file._2_1_ = false;
        local_68.context.file._3_1_ = false;
        local_68.context.file._4_1_ = false;
        local_68.context.file._5_1_ = false;
        local_68.context.file._6_2_ = 0;
        local_68.context.function._0_4_ = Invalid;
        local_68.context.category = "default";
        QMessageLogger::warning
                  (&local_68,
                   "QObject::setParent: Cannot set parent, new parent is in a different thread");
        (this->super_QObjectData).parent = (QObject *)0x0;
        goto LAB_00289653;
      }
      QList<QObject_*>::append(&pQVar3->children,q);
      uVar1 = *(uint *)&(this->super_QObjectData).field_0x30;
      if ((((uVar1 & 0x10) != 0) && ((uVar1 & 1) == 0)) &&
         ((*(uint *)&((((this->super_QObjectData).parent)->d_ptr).d)->field_0x30 & 0x20) != 0)) {
        local_68.context.function._0_4_ = 0xaaaaaaaa;
        local_68.context.function._4_4_ = 0xaaaaaaaa;
        local_68.context.version = -0x55555556;
        local_68.context.line = -0x55555556;
        local_68.context.file._0_2_ = 0xaaaa;
        local_68.context.file._2_1_ = true;
        local_68.context.file._3_1_ = true;
        local_68.context.file._4_1_ = true;
        local_68.context.file._5_1_ = true;
        local_68.context.file._6_2_ = 0xaaaa;
        QChildEvent::QChildEvent((QChildEvent *)&local_68,ChildAdded,q);
        QCoreApplication::sendEvent((this->super_QObjectData).parent,(QEvent *)&local_68);
        QTimerEvent::~QTimerEvent((QTimerEvent *)&local_68);
      }
    }
    if (((this->super_QObjectData).field_0x31 & 8) != 0) {
      local_68.context.version = -0x55555556;
      local_68.context.line = -0x55555556;
      local_68.context.file._0_2_ = 0xaaaa;
      local_68.context.file._2_1_ = true;
      local_68.context.file._3_1_ = true;
      local_68.context.file._4_1_ = true;
      local_68.context.file._5_1_ = true;
      local_68.context.file._6_2_ = 0xaaaa;
      QEvent::QEvent((QEvent *)&local_68,ParentChange);
      QCoreApplication::sendEvent(q,(QEvent *)&local_68);
      QTimerEvent::~QTimerEvent((QTimerEvent *)&local_68);
    }
  }
LAB_00289653:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QObjectPrivate::setParent_helper(QObject *o)
{
    Q_Q(QObject);
    Q_ASSERT_X(q != o, Q_FUNC_INFO, "Cannot parent a QObject to itself");
#ifdef QT_DEBUG
    const auto checkForParentChildLoops = qScopeGuard([&](){
        int depth = 0;
        auto p = parent;
        while (p) {
            if (++depth == CheckForParentChildLoopsWarnDepth) {
                qWarning("QObject %p (class: '%s', object name: '%s') may have a loop in its parent-child chain; "
                         "this is undefined behavior",
                         q, q->metaObject()->className(), qPrintable(q->objectName()));
            }
            p = p->parent();
        }
    });
#endif

    if (o == parent)
        return;

    if (parent) {
        QObjectPrivate *parentD = parent->d_func();
        if (parentD->isDeletingChildren && wasDeleted
            && parentD->currentChildBeingDeleted == q) {
            // don't do anything since QObjectPrivate::deleteChildren() already
            // cleared our entry in parentD->children.
        } else {
            const int index = parentD->children.indexOf(q);
            if (index < 0) {
                // we're probably recursing into setParent() from a ChildRemoved event, don't do anything
            } else if (parentD->isDeletingChildren) {
                parentD->children[index] = nullptr;
            } else {
                parentD->children.removeAt(index);
                if (sendChildEvents && parentD->receiveChildEvents) {
                    QChildEvent e(QEvent::ChildRemoved, q);
                    QCoreApplication::sendEvent(parent, &e);
                }
            }
        }
    }

    if (receiveParentEvents) {
        Q_ASSERT(!isWidget); // Handled in QWidget
        QEvent e(QEvent::ParentAboutToChange);
        QCoreApplication::sendEvent(q, &e);
    }

    parent = o;

    if (parent) {
        // object hierarchies are constrained to a single thread
        if (threadData.loadRelaxed() != parent->d_func()->threadData.loadRelaxed()) {
            qWarning("QObject::setParent: Cannot set parent, new parent is in a different thread");
            parent = nullptr;
            return;
        }
        parent->d_func()->children.append(q);
        if (sendChildEvents && parent->d_func()->receiveChildEvents) {
            if (!isWidget) {
                QChildEvent e(QEvent::ChildAdded, q);
                QCoreApplication::sendEvent(parent, &e);
            }
        }
    }

    if (receiveParentEvents) {
        Q_ASSERT(!isWidget); // Handled in QWidget
        QEvent e(QEvent::ParentChange);
        QCoreApplication::sendEvent(q, &e);
    }
}